

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFraigPartitioned(Vec_Ptr_t *vStore,void *pParams)

{
  uint nCap;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  Vec_Ptr_t *p;
  Abc_Frame_t *pAVar5;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *vParts;
  Vec_Int_t *vOuts;
  Abc_Ntk_t *pAVar6;
  Abc_Ntk_t *pAVar7;
  uint uVar8;
  int i;
  uint i_00;
  int iVar9;
  
  pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(vStore,0);
  if (pAVar4->ntkType == ABC_NTK_STRASH) {
    p = Abc_NtkPartitionSmart(pAVar4,300,0);
    pAVar5 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar5,"unset progressbar");
    p_00 = Vec_PtrAlloc(1000);
    nCap = p->nSize;
    vParts = Vec_PtrAlloc(nCap);
    uVar8 = 0;
    if (0 < (int)nCap) {
      uVar8 = nCap;
    }
    i_00 = 0;
    while (iVar9 = 1, i_00 != uVar8) {
      vOuts = (Vec_Int_t *)Vec_PtrEntry(p,i_00);
      Abc_NtkConvertCos(pAVar4,vOuts,p_00);
      pAVar6 = Abc_NtkCreateConeArray(pAVar4,p_00,0);
      for (; iVar9 < vStore->nSize; iVar9 = iVar9 + 1) {
        pAVar7 = (Abc_Ntk_t *)Vec_PtrEntry(vStore,iVar9);
        Abc_NtkConvertCos(pAVar7,vOuts,p_00);
        Abc_NtkAppendToCone(pAVar6,pAVar7,p_00);
      }
      i_00 = i_00 + 1;
      uVar1 = pAVar6->vPis->nSize;
      uVar2 = pAVar6->vPos->nSize;
      uVar3 = pAVar6->nObjCounts[7];
      iVar9 = Abc_AigLevel(pAVar6);
      printf("Fraiging part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
             (ulong)i_00,(ulong)nCap,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,iVar9);
      pAVar7 = Abc_NtkFraig(pAVar6,pParams,1,0);
      Vec_PtrPush(vParts,pAVar7);
      Abc_NtkDelete(pAVar6);
    }
    printf(
          "                                                                                          \r"
          );
    Vec_VecFree((Vec_Vec_t *)p);
    pAVar5 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar5,"set progressbar");
    pAVar4 = Abc_NtkPartStitchChoices(pAVar4,vParts);
    iVar9 = vParts->nSize;
    for (i = 0; i < iVar9; i = i + 1) {
      pAVar6 = (Abc_Ntk_t *)Vec_PtrEntry(vParts,i);
      Abc_NtkDelete(pAVar6);
    }
    Vec_PtrFree(vParts);
    Vec_PtrFree(p_00);
    return pAVar4;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                ,0x453,"Abc_Ntk_t *Abc_NtkFraigPartitioned(Vec_Ptr_t *, void *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFraigPartitioned( Vec_Ptr_t * vStore, void * pParams )
{
    Vec_Ptr_t * vParts, * vFraigs, * vOnePtr;
    Vec_Int_t * vOne;
    Abc_Ntk_t * pNtk, * pNtk2, * pNtkAig, * pNtkFraig;
    int i, k;

    // perform partitioning
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( vStore, 0 );
    assert( Abc_NtkIsStrash(pNtk) );
//    vParts = Abc_NtkPartitionNaive( pNtk, 20 );
    vParts = Abc_NtkPartitionSmart( pNtk, 300, 0 );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // fraig each partition
    vOnePtr = Vec_PtrAlloc( 1000 );
    vFraigs = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        // start the partition 
        Abc_NtkConvertCos( pNtk, vOne, vOnePtr );
        pNtkAig = Abc_NtkCreateConeArray( pNtk, vOnePtr, 0 );
        // add nodes to the partition
        Vec_PtrForEachEntryStart( Abc_Ntk_t *, vStore, pNtk2, k, 1 )
        {
            Abc_NtkConvertCos( pNtk2, vOne, vOnePtr );
            Abc_NtkAppendToCone( pNtkAig, pNtk2, vOnePtr );
        }
        printf( "Fraiging part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Abc_NtkPiNum(pNtkAig), Abc_NtkPoNum(pNtkAig), 
            Abc_NtkNodeNum(pNtkAig), Abc_AigLevel(pNtkAig) );
        // fraig the partition
        pNtkFraig = Abc_NtkFraig( pNtkAig, pParams, 1, 0 );
        Vec_PtrPush( vFraigs, pNtkFraig );
        Abc_NtkDelete( pNtkAig );
    }
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // derive the final network
    pNtkFraig = Abc_NtkPartStitchChoices( pNtk, vFraigs );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vFraigs, pNtkAig, i )
        Abc_NtkDelete( pNtkAig );
    Vec_PtrFree( vFraigs );
    Vec_PtrFree( vOnePtr );
    return pNtkFraig;
}